

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_BracketOperatorCrashing_Test<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_BracketOperatorCrashing_Test<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_RDI;
  int i;
  int iters;
  int *in_stack_ffffffffffffff78;
  HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffff80;
  int *in_stack_ffffffffffffff88;
  int index;
  HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffff90;
  int *in_stack_ffffffffffffff98;
  value_type local_48;
  undefined1 local_39;
  key_type local_38;
  value_type local_30;
  undefined1 local_21;
  key_type local_20;
  int local_18;
  int local_14;
  key_type local_10;
  
  local_10 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_ffffffffffffff80,(key_type *)in_stack_ffffffffffffff78);
  for (local_14 = 0; local_14 < 10; local_14 = local_14 + 1) {
    for (local_18 = 0x21; index = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20), local_18 < 0x85;
        local_18 = local_18 + 1) {
      in_stack_ffffffffffffff98 =
           &(in_RDI->
            super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ).ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
            super_Hasher.num_compares_;
      local_20 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 ::UniqueKey(in_stack_ffffffffffffff90,index);
      in_stack_ffffffffffffff90 =
           (HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            *)&(in_RDI->
               super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ).ht_.rep.settings.
               super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher.
               num_compares_;
      local_30 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 ::UniqueObject(in_stack_ffffffffffffff80,
                                (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      local_21 = google::
                 HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                 ::get_data((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                             *)in_stack_ffffffffffffff90,&local_30);
      google::
      HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
      ::bracket_assign<bool>
                (in_RDI,(key_type *)in_stack_ffffffffffffff98,(bool *)in_stack_ffffffffffffff90);
    }
    google::
    HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::clear_no_resize((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                       *)0xfeb94d);
    in_stack_ffffffffffffff80 =
         (HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)&(in_RDI->
             super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ).ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
             super_Hasher.num_compares_;
    local_38 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_ffffffffffffff90,index);
    in_stack_ffffffffffffff78 =
         &(in_RDI->
          super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ).ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
          super_Hasher.num_compares_;
    local_48 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject(in_stack_ffffffffffffff80,
                              (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    local_39 = google::
               HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               ::get_data((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                           *)in_stack_ffffffffffffff78,&local_48);
    google::
    HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::bracket_assign<bool>
              (in_RDI,(key_type *)in_stack_ffffffffffffff98,(bool *)in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff88 =
         &(in_RDI->
          super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ).ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
          super_Hasher.num_compares_;
    HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey(in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_ffffffffffffff80,(key_type *)in_stack_ffffffffffffff78);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, BracketOperatorCrashing) {
  this->ht_.set_deleted_key(this->UniqueKey(1));
  for (int iters = 0; iters < 10; iters++) {
    // We start at 33 because after shrinking, we'll be at 32 buckets.
    for (int i = 33; i < 133; i++) {
      this->ht_.bracket_assign(this->UniqueKey(i),
                               this->ht_.get_data(this->UniqueObject(i)));
    }
    this->ht_.clear_no_resize();
    // This will force a shrink on the next insert, which we want to test.
    this->ht_.bracket_assign(this->UniqueKey(2),
                             this->ht_.get_data(this->UniqueObject(2)));
    this->ht_.erase(this->UniqueKey(2));
  }
}